

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::iterate
          (MultisampleTextureUsageCase *this)

{
  TestLog *pTVar1;
  RenderContext *context;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RenderTarget *pRVar13;
  Surface *surface;
  void *__buf;
  char *description;
  qpTestResult testResult;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  Surface result;
  Buffer vertexAttibBuffer;
  ScopedLogSection section;
  Random rnd;
  float clearColor [4];
  float local_2c0;
  Surface local_2b8;
  undefined4 local_29c;
  string local_298;
  LogImageSet local_278;
  ScopedLogSection local_238;
  ulong local_230;
  string local_228;
  string local_208;
  string local_1e8;
  deRandom local_1c8;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  long lVar11;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b8 = (undefined1  [8])&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Sample","");
  local_278.m_name._M_dataplus._M_p = (pointer)&local_278.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"Render to texture and sample texture","");
  tcu::ScopedLogSection::ScopedLogSection(&local_238,pTVar1,(string *)local_1b8,&local_278.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_name._M_dataplus._M_p != &local_278.m_name.field_2) {
    operator_delete(local_278.m_name._M_dataplus._M_p,
                    CONCAT44(local_278.m_name.field_2._M_allocated_capacity._4_4_,
                             local_278.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  tcu::Surface::Surface(&local_2b8,0x100,0x100);
  local_2c0 = 1.0;
  fVar17 = 0.0;
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat == false)) {
    if ((this->m_isUnsignedFormat & 1U) == 0) {
      fVar17 = 1.0;
    }
    if (this->m_isSignedFormat == false) {
      if (this->m_isUnsignedFormat == false) {
        local_2c0 = -1.0;
      }
      else {
        local_2c0 = 200.0;
      }
    }
    else {
      fVar17 = -100.0;
      local_2c0 = 100.0;
    }
  }
  uVar3 = (this->m_type >> 0x10 ^ this->m_type ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  deRandom_init(&local_1c8,uVar3 >> 0xf ^ uVar3);
  fVar16 = deRandom_getFloat(&local_1c8);
  local_2c0 = (local_2c0 - fVar17) * fVar16 + fVar17;
  if ((this->m_isSignedFormat != false) || (this->m_isUnsignedFormat == true)) {
    local_2c0 = floorf(local_2c0);
  }
  if (Functional::(anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::
      fullscreenQuad == '\0') {
    _GLOBAL__N_1::MultisampleTextureUsageCase::iterate();
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar4);
  uVar5 = (**(code **)(lVar11 + 0x780))((this->m_drawShader->m_program).m_program,"a_position");
  uVar6 = (**(code **)(lVar11 + 0xb48))((this->m_drawShader->m_program).m_program,"u_writeValue");
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar12 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_278,(Functions *)CONCAT44(extraout_var_00,iVar4),pOVar12);
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"Filling multisample texture with value ",0x27);
  std::ostream::_M_insert<double>((double)local_2c0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar11 + 0x40))(0x8892,local_278.m_name.field_2._M_allocated_capacity._0_4_);
  (**(code **)(lVar11 + 0x150))
            (0x8892,0x40,
             Functional::(anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)
             ::fullscreenQuad,0x88e4);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"bufferdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x577);
  (**(code **)(lVar11 + 0x78))(0x8d40,this->m_fboID);
  (**(code **)(lVar11 + 0x1a00))(0,0,0x100,0x100);
  if (this->m_isColorFormat == true) {
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    pp_Stack_1b0 = (_func_int **)0x0;
    (**(code **)(lVar11 + 0x1a8))(0x1800,0);
  }
  else if (this->m_isSignedFormat == true) {
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    pp_Stack_1b0 = (_func_int **)0x0;
    (**(code **)(lVar11 + 0x1b0))(0x1800,0);
  }
  else if (this->m_isUnsignedFormat == true) {
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    pp_Stack_1b0 = (_func_int **)0x0;
    (**(code **)(lVar11 + 0x1b8))(0x1800,0);
  }
  else if (this->m_isDepthFormat == true) {
    local_1b8._0_4_ = 0x3f000000;
    (**(code **)(lVar11 + 0x1a8))(0x1801,0);
  }
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"clear buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x593);
  (**(code **)(lVar11 + 0x19f0))(uVar5,4,0x1406,0,0,0);
  (**(code **)(lVar11 + 0x610))(uVar5);
  (**(code **)(lVar11 + 0x1680))((this->m_drawShader->m_program).m_program);
  (**(code **)(lVar11 + 0x14e0))(local_2c0,uVar6);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x59d);
  if (this->m_isDepthFormat == true) {
    (**(code **)(lVar11 + 0x5e0))(0xb71);
    (**(code **)(lVar11 + 0x4a0))(0x207);
  }
  (**(code **)(lVar11 + 0x538))(5,0,4);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5a6);
  if (this->m_isDepthFormat == true) {
    (**(code **)(lVar11 + 0x4e8))(0xb71);
  }
  (**(code **)(lVar11 + 0x518))(uVar5);
  (**(code **)(lVar11 + 0x1680))(0);
  (**(code **)(lVar11 + 0x78))(0x8d40,0);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5b0);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_278);
  if (Functional::(anonymous_namespace)::MultisampleTextureUsageCase::
      sampleTexture(tcu::Surface&,float)::fullscreenQuad == '\0') {
    _GLOBAL__N_1::MultisampleTextureUsageCase::iterate();
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var_01,iVar4);
  uVar5 = (**(code **)(lVar11 + 0x780))((this->m_samplerShader->m_program).m_program,"a_position");
  uVar6 = (**(code **)(lVar11 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_sampler");
  uVar8 = (**(code **)(lVar11 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_maxSamples")
  ;
  local_29c = (**(code **)(lVar11 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_layer");
  uVar9 = (**(code **)(lVar11 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_cmpValue");
  local_230 = (ulong)this->m_isArrayType;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar12 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_278,(Functions *)CONCAT44(extraout_var_02,iVar4),pOVar12);
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"Sampling from texture.",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar11 + 0x40))(0x8892,local_278.m_name.field_2._M_allocated_capacity._0_4_);
  (**(code **)(lVar11 + 0x150))
            (0x8892,0x40,
             Functional::(anonymous_namespace)::MultisampleTextureUsageCase::
             sampleTexture(tcu::Surface&,float)::fullscreenQuad,0x88e4);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"bufferdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5cc);
  (**(code **)(lVar11 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar11 + 0x188))(0x4000);
  (**(code **)(lVar11 + 0x19f0))(uVar5,4,0x1406,0,0,0);
  (**(code **)(lVar11 + 0x610))(uVar5);
  (**(code **)(lVar11 + 0x1680))((this->m_samplerShader->m_program).m_program);
  (**(code **)(lVar11 + 0x14f0))(uVar6,0);
  (**(code **)(lVar11 + 0x14f0))(uVar8,this->m_numSamples);
  if (this->m_isArrayType == true) {
    (**(code **)(lVar11 + 0x14f0))(local_29c,3);
  }
  (**(code **)(lVar11 + 0x14e0))(local_2c0,uVar9);
  (**(code **)(lVar11 + 0xb8))((int)local_230 * 2 + 0x9100,this->m_textureID);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e0);
  (**(code **)(lVar11 + 0x538))(5,0,4);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e3);
  (**(code **)(lVar11 + 0x518))(uVar5);
  (**(code **)(lVar11 + 0x1680))(0);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e9);
  (**(code **)(lVar11 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_298._M_dataplus._M_p = (char *)0x300000008;
  if ((void *)local_2b8.m_pixels.m_cap != (void *)0x0) {
    local_2b8.m_pixels.m_cap = (size_t)local_2b8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_298,local_2b8.m_width,
             local_2b8.m_height,1,(void *)local_2b8.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b8);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_278);
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"Verifying image.",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  if (0 < local_2b8.m_height) {
    bVar2 = false;
    iVar15 = 0;
    iVar4 = local_2b8.m_height;
    iVar10 = local_2b8.m_width;
    do {
      if (0 < iVar10) {
        iVar14 = 0;
        do {
          uVar3 = *(uint *)((long)local_2b8.m_pixels.m_ptr + (long)(iVar10 * iVar15 + iVar14) * 4);
          pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
          iVar10 = (pRVar13->m_pixelFormat).redBits;
          pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
          iVar4 = (pRVar13->m_pixelFormat).greenBits;
          pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
          if (((1 << (8U - (char)iVar10 & 0x1f) < (int)(uVar3 & 0xff)) ||
              ((int)(uVar3 >> 8 & 0xff) < (-1 << (8U - (char)iVar4 & 0x1f)) + 0xff)) ||
             (1 << (8U - (char)(pRVar13->m_pixelFormat).blueBits & 0x1f) <
              (int)(uVar3 >> 0x10 & 0xff))) {
            bVar2 = true;
          }
          iVar14 = iVar14 + 1;
          iVar4 = local_2b8.m_height;
          iVar10 = local_2b8.m_width;
        } while (iVar14 < local_2b8.m_width);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < iVar4);
    if (bVar2) {
      local_1b8 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,"Invalid pixels found.",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_1b8._0_4_ = S;
      local_1b8._4_4_ = SNORM_INT8;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)local_1b8);
      local_298.field_2._M_allocated_capacity = (size_type)local_1b8;
      builtin_strncpy(local_298._M_dataplus._M_p,"Verification result",0x13);
      local_298._M_string_length = (size_type)local_1b8;
      local_298._M_dataplus._M_p[(long)local_1b8] = '\0';
      local_1b8._0_4_ = S;
      local_1b8._4_4_ = SNORM_INT8;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_228,(ulong)local_1b8);
      local_228.field_2._M_allocated_capacity = (size_type)local_1b8;
      builtin_strncpy(local_228._M_dataplus._M_p,"Result of rendering",0x13);
      local_228._M_string_length = (size_type)local_1b8;
      local_228._M_dataplus._M_p[(long)local_1b8] = '\0';
      tcu::LogImageSet::LogImageSet(&local_278,&local_298,&local_228);
      tcu::TestLog::startImageSet
                (pTVar1,local_278.m_name._M_dataplus._M_p,local_278.m_description._M_dataplus._M_p);
      local_1e8.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_1e8.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_1e8._M_string_length = 6;
      local_1e8.field_2._M_local_buf[6] = '\0';
      local_208.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_208.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_208._M_string_length = 6;
      local_208.field_2._M_local_buf[6] = '\0';
      surface = &local_2b8;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b8,&local_1e8,&local_208,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar1,__buf,(size_t)surface);
      tcu::TestLog::endImageSet(pTVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_p != local_188) {
        operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
      }
      if (local_1b8 != (undefined1  [8])&local_1a8) {
        operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT17(local_208.field_2._M_local_buf[7],
                                 CONCAT16(local_208.field_2._M_local_buf[6],
                                          CONCAT24(local_208.field_2._M_allocated_capacity._4_2_,
                                                   local_208.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT17(local_1e8.field_2._M_local_buf[7],
                                 CONCAT16(local_1e8.field_2._M_local_buf[6],
                                          CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                   local_1e8.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278.m_description._M_dataplus._M_p != &local_278.m_description.field_2) {
        operator_delete(local_278.m_description._M_dataplus._M_p,
                        local_278.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278.m_name._M_dataplus._M_p != &local_278.m_name.field_2) {
        operator_delete(local_278.m_name._M_dataplus._M_p,
                        CONCAT44(local_278.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_278.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        (ulong)(local_298.field_2._M_allocated_capacity + 1));
      }
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_0151f723;
    }
  }
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"No invalid pixels found.",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_0151f723:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&local_2b8);
  tcu::TestLog::endSection(local_238.m_log);
  return STOP;
}

Assistant:

MultisampleTextureUsageCase::IterateResult MultisampleTextureUsageCase::iterate (void)
{
	const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Sample", "Render to texture and sample texture");
	tcu::Surface				result			(s_textureSize, s_textureSize);
	const float					minValue		= (m_isColorFormat || m_isDepthFormat) ? (0.0f) : (m_isSignedFormat) ? (-100.0f) : (m_isUnsignedFormat) ? (0.0f)	: ( 1.0f);
	const float					maxValue		= (m_isColorFormat || m_isDepthFormat) ? (1.0f) : (m_isSignedFormat) ? ( 100.0f) : (m_isUnsignedFormat) ? (200.0f)	: (-1.0f);
	de::Random					rnd				(deUint32Hash((deUint32)m_type));
	const float					rawValue		= rnd.getFloat(minValue, maxValue);
	const float					preparedValue	= (m_isSignedFormat || m_isUnsignedFormat) ? (deFloatFloor(rawValue)) : (rawValue);

	// draw to fbo with a random value

	renderToTexture(preparedValue);

	// draw from texture to front buffer

	sampleTexture(result, preparedValue);

	// result is ok?

	if (verifyImage(result))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}